

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrReach.c
# Opt level: O2

DdNode ** Aig_ManCreatePartitions(DdManager *dd,Aig_Man_t *p,int fReorder,int fVerbose)

{
  FILE *pFVar1;
  uint uVar2;
  DdNode **nodeArray;
  void *pvVar3;
  DdNode *pDVar4;
  long lVar5;
  ulong uVar6;
  
  if (dd->size == p->nTruePis + p->nRegs) {
    Cudd_bddIthVar(dd,p->nRegs + dd->size + -1);
    if (fReorder == 0) {
      Cudd_AutodynDisable(dd);
    }
    else {
      Cudd_AutodynEnable(dd,CUDD_REORDER_SYMM_SIFT);
    }
    uVar6 = (ulong)p->nRegs;
    nodeArray = (DdNode **)malloc(uVar6 << 3);
    for (lVar5 = 0; lVar5 < (int)uVar6; lVar5 = lVar5 + 1) {
      pvVar3 = Vec_PtrEntry(p->vCos,p->nTruePos + (int)lVar5);
      pDVar4 = Cudd_bddIthVar(dd,p->nTruePis + p->nRegs + (int)lVar5);
      pDVar4 = Cudd_bddXnor(dd,pDVar4,*(DdNode **)((long)pvVar3 + 0x28));
      nodeArray[lVar5] = pDVar4;
      Cudd_Ref(pDVar4);
      uVar6 = (ulong)(uint)p->nRegs;
    }
    Aig_ManFreeGlobalBdds(p,dd);
    pFVar1 = _stdout;
    if (fReorder != 0) {
      if (fVerbose == 0) {
        Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100);
        Cudd_AutodynDisable(dd);
      }
      else {
        uVar2 = Cudd_SharingSize(nodeArray,p->nRegs);
        fprintf(pFVar1,"BDD nodes in the partitions before reordering %d.\n",(ulong)uVar2);
        Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100);
        Cudd_AutodynDisable(dd);
        pFVar1 = _stdout;
        uVar2 = Cudd_SharingSize(nodeArray,p->nRegs);
        fprintf(pFVar1,"BDD nodes in the partitions after reordering %d.\n",(ulong)uVar2);
      }
    }
    return nodeArray;
  }
  __assert_fail("dd->size == Saig_ManCiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/bbr/bbrReach.c"
                ,0xc3,"DdNode **Aig_ManCreatePartitions(DdManager *, Aig_Man_t *, int, int)");
}

Assistant:

DdNode ** Aig_ManCreatePartitions( DdManager * dd, Aig_Man_t * p, int fReorder, int fVerbose )
{
    DdNode ** pbParts;
    DdNode * bVar;
    Aig_Obj_t * pNode;
    int i;

    // extand the BDD manager to represent NS variables
    assert( dd->size == Saig_ManCiNum(p) );
    Cudd_bddIthVar( dd, Saig_ManCiNum(p) + Saig_ManRegNum(p) - 1 );

    // enable reordering
    if ( fReorder )
        Cudd_AutodynEnable( dd, CUDD_REORDER_SYMM_SIFT );
    else
        Cudd_AutodynDisable( dd );

    // compute the transition relation
    pbParts = ABC_ALLOC( DdNode *, Saig_ManRegNum(p) );
    Saig_ManForEachLi( p, pNode, i )
    {
        bVar  = Cudd_bddIthVar( dd, Saig_ManCiNum(p) + i );
        pbParts[i] = Cudd_bddXnor( dd, bVar, Aig_ObjGlobalBdd(pNode) );  Cudd_Ref( pbParts[i] );
    }
    // free global BDDs
    Aig_ManFreeGlobalBdds( p, dd );

    // reorder and disable reordering
    if ( fReorder )
    {
        if ( fVerbose )
            fprintf( stdout, "BDD nodes in the partitions before reordering %d.\n", Cudd_SharingSize(pbParts,Saig_ManRegNum(p)) );
        Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
        Cudd_AutodynDisable( dd );
        if ( fVerbose )
            fprintf( stdout, "BDD nodes in the partitions after reordering %d.\n", Cudd_SharingSize(pbParts,Saig_ManRegNum(p)) );
    }
    return pbParts;
}